

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O3

Lpk_Man_t * Lpk_ManStart(Lpk_Par_t *pPars)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Lpk_Man_t *pLVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  undefined8 *puVar11;
  void *pvVar12;
  Kit_DsdMan_t *pKVar13;
  uint *puVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  if (0x10 < pPars->nLutsMax) {
    __assert_fail("pPars->nLutsMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkMan.c"
                  ,0x31,"Lpk_Man_t *Lpk_ManStart(Lpk_Par_t *)");
  }
  uVar18 = pPars->nVarsMax;
  uVar20 = (ulong)uVar18;
  if (0xf < uVar18 - 1) {
    __assert_fail("pPars->nVarsMax > 0 && pPars->nVarsMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkMan.c"
                  ,0x32,"Lpk_Man_t *Lpk_ManStart(Lpk_Par_t *)");
  }
  pLVar6 = (Lpk_Man_t *)calloc(1,0x7dc358);
  pLVar6->pPars = pPars;
  pLVar6->nCutsMax = 10000;
  uVar21 = 0;
  uVar3 = 1 << ((byte)(uVar18 - 5) & 0x1f);
  if (uVar18 < 6) {
    uVar3 = 1;
  }
  uVar17 = uVar18 - 5;
  if (uVar18 < 6) {
    uVar17 = 0;
  }
  ppvVar7 = (void **)malloc(((ulong)uVar3 * 4 + 8) * uVar20);
  auVar4 = _DAT_0094e250;
  lVar15 = uVar20 - 1;
  auVar23._8_4_ = (int)lVar15;
  auVar23._0_8_ = lVar15;
  auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
  auVar23 = auVar23 ^ _DAT_0094e250;
  auVar24 = _DAT_0094e240;
  do {
    auVar28 = auVar24 ^ auVar4;
    lVar15 = auVar24._8_8_;
    if ((bool)(~(auVar28._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar28._0_4_ ||
                auVar23._4_4_ < auVar28._4_4_) & 1)) {
      *(ulong *)((long)ppvVar7 + uVar21) =
           (long)ppvVar7 + (auVar24._0_8_ << (ulong)uVar17) * 4 + uVar20 * 8;
    }
    if ((auVar28._12_4_ != auVar23._12_4_ || auVar28._8_4_ <= auVar23._8_4_) &&
        auVar28._12_4_ <= auVar23._12_4_) {
      *(ulong *)((long)ppvVar7 + uVar21 + 8) = (long)ppvVar7 + lVar15 * 4 + uVar20 * 8;
    }
    auVar24._0_8_ = auVar24._0_8_ + 2;
    auVar24._8_8_ = lVar15 + 2;
    uVar21 = uVar21 + 0x10;
  } while ((uVar18 * 8 + 8 & 0x1f0) != uVar21);
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  auVar24 = _DAT_0094e250;
  pVVar8->nSize = uVar18;
  pVVar8->nCap = uVar18;
  pVVar8->pArray = ppvVar7;
  auVar23 = _DAT_0094f530;
  auVar4 = _DAT_0094e240;
  lVar15 = (ulong)uVar3 - 1;
  auVar28._8_4_ = (int)lVar15;
  auVar28._0_8_ = lVar15;
  auVar28._12_4_ = (int)((ulong)lVar15 >> 0x20);
  uVar21 = 0;
  auVar28 = auVar28 ^ auVar24;
  do {
    pvVar12 = ppvVar7[uVar21];
    iVar22 = auVar28._0_4_;
    iVar5 = auVar28._4_4_;
    if (uVar21 < 5) {
      uVar1 = (&DAT_009f08b0)[uVar21];
      uVar19 = 0;
      auVar29 = auVar4;
      auVar30 = auVar23;
      do {
        auVar31 = auVar29 ^ auVar24;
        if ((bool)(~(auVar31._4_4_ == iVar5 && iVar22 < auVar31._0_4_ || iVar5 < auVar31._4_4_) & 1)
           ) {
          *(undefined4 *)((long)pvVar12 + uVar19 * 4) = uVar1;
        }
        if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
            auVar31._12_4_ <= auVar28._12_4_) {
          *(undefined4 *)((long)pvVar12 + uVar19 * 4 + 4) = uVar1;
        }
        iVar26 = SUB164(auVar30 ^ auVar24,4);
        if (iVar26 <= iVar5 && (iVar26 != iVar5 || SUB164(auVar30 ^ auVar24,0) <= iVar22)) {
          *(undefined4 *)((long)pvVar12 + uVar19 * 4 + 8) = uVar1;
          *(undefined4 *)((long)pvVar12 + uVar19 * 4 + 0xc) = uVar1;
        }
        uVar19 = uVar19 + 4;
        lVar15 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 4;
        auVar29._8_8_ = lVar15 + 4;
        lVar15 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 4;
        auVar30._8_8_ = lVar15 + 4;
      } while ((uVar3 + 3 & 0xfffffffc) != uVar19);
    }
    else {
      uVar18 = 1 << ((char)uVar21 - 5U & 0x1f);
      uVar19 = 0;
      auVar31 = auVar4;
      do {
        bVar2 = iVar22 < SUB164(auVar31 ^ auVar24,0);
        iVar26 = SUB164(auVar31 ^ auVar24,4);
        if ((iVar5 < iVar26 || iVar26 == iVar5 && bVar2) != true) {
          *(uint *)((long)pvVar12 + uVar19 * 4) = -(uint)((uVar18 & (uint)uVar19) != 0);
        }
        if (iVar5 >= iVar26 && (iVar26 != iVar5 || !bVar2)) {
          *(uint *)((long)pvVar12 + uVar19 * 4 + 4) = -(uint)(((uint)uVar19 + 1 & uVar18) != 0);
        }
        uVar19 = uVar19 + 2;
        lVar15 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 2;
        auVar31._8_8_ = lVar15 + 2;
      } while ((uVar3 + 1 & 0xfffffffe) != uVar19);
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != uVar20);
  pLVar6->vTtElems = pVVar8;
  iVar22 = pPars->nVarsMax;
  iVar5 = 1 << ((char)iVar22 - 5U & 0x1f);
  if (iVar22 < 6) {
    iVar5 = 1;
  }
  ppvVar7 = (void **)malloc((long)iVar5 * 0x1000 + 0x2000);
  lVar15 = 0x2000;
  lVar16 = 0;
  do {
    ppvVar7[lVar16] = (void *)((long)ppvVar7 + lVar15);
    lVar16 = lVar16 + 1;
    lVar15 = lVar15 + (long)iVar5 * 4;
  } while (lVar16 != 0x400);
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 0x400;
  pVVar8->nSize = 0x400;
  pVVar8->pArray = ppvVar7;
  pLVar6->vTtNodes = pVVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x1000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x4000);
  pVVar9->pArray = piVar10;
  pLVar6->vCover = pVVar9;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 0x20;
  pVVar8->nSize = 0;
  ppvVar7 = (void **)malloc(0x100);
  pVVar8->pArray = ppvVar7;
  pLVar6->vLeaves = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 0x20;
  pVVar8->nSize = 0;
  ppvVar7 = (void **)malloc(0x100);
  pVVar8->pArray = ppvVar7;
  pLVar6->vTemp = pVVar8;
  lVar15 = 0xfb846;
  do {
    puVar11 = (undefined8 *)malloc(0x10);
    *puVar11 = 100;
    pvVar12 = malloc(400);
    puVar11[1] = pvVar12;
    *(undefined8 **)(pLVar6->pCuts[0].uSign + lVar15 * 2 + -0xb) = puVar11;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xfb84e);
  pKVar13 = Kit_DsdManAlloc(iVar22,0x40);
  pLVar6->pDsdMan = pKVar13;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x8000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x20000);
  pVVar9->pArray = piVar10;
  pLVar6->vMemory = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x400);
  pVVar9->pArray = piVar10;
  pLVar6->vBddDir = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x400);
  pVVar9->pArray = piVar10;
  pLVar6->vBddInv = pVVar9;
  iVar22 = pPars->nVarsMax + -5;
  lVar15 = 0;
  iVar5 = 1 << ((byte)iVar22 & 0x1f);
  if (pPars->nVarsMax < 6) {
    iVar22 = 0;
    iVar5 = 1;
  }
  puVar14 = (uint *)malloc((long)(iVar5 << 5) << 2);
  pLVar6->ppTruths[0][0] = puVar14;
  puVar14 = puVar14 + iVar5;
  pLVar6->ppTruths[1][0] = puVar14;
  pLVar6->ppTruths[1][1] = puVar14 + iVar5;
  puVar14 = puVar14 + iVar5 * 2;
  pLVar6->ppTruths[2][0] = puVar14;
  auVar24 = _DAT_0094e250;
  auVar4 = _DAT_0094e240;
  iVar26 = 1;
  iVar27 = 2;
  do {
    auVar32._8_4_ = (int)lVar15;
    auVar32._0_8_ = lVar15;
    auVar32._12_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar23 = (auVar32 | auVar4) ^ auVar24;
    if (auVar23._4_4_ == -0x80000000 && auVar23._0_4_ < -0x7ffffffd) {
      pLVar6->ppTruths[2][lVar15 + 1] =
           puVar14 + CONCAT44(-(uint)(iVar26 << iVar22 < 0),iVar26 << iVar22);
      pLVar6->ppTruths[2][lVar15 + 2] = puVar14 + CONCAT44(-(uint)(iVar27 < 0),iVar27);
    }
    lVar15 = lVar15 + 2;
    iVar26 = iVar26 + 2;
    iVar27 = iVar27 + 2;
  } while (lVar15 != 4);
  puVar14 = puVar14 + iVar5 * 4;
  pLVar6->ppTruths[3][0] = puVar14;
  iVar26 = 1;
  iVar27 = 2;
  lVar15 = 0;
  do {
    auVar33._8_4_ = (int)lVar15;
    auVar33._0_8_ = lVar15;
    auVar33._12_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar23 = (auVar33 | auVar4) ^ auVar24;
    if (auVar23._4_4_ == -0x80000000 && auVar23._0_4_ < -0x7ffffff9) {
      pLVar6->ppTruths[3][lVar15 + 1] =
           puVar14 + CONCAT44(-(uint)(iVar26 << iVar22 < 0),iVar26 << iVar22);
      pLVar6->ppTruths[3][lVar15 + 2] = puVar14 + CONCAT44(-(uint)(iVar27 < 0),iVar27);
    }
    lVar15 = lVar15 + 2;
    iVar26 = iVar26 + 2;
    iVar27 = iVar27 + 2;
  } while (lVar15 != 8);
  puVar14 = puVar14 + (iVar5 << 3);
  pLVar6->ppTruths[4][0] = puVar14;
  iVar5 = 1;
  iVar26 = 2;
  lVar15 = 0;
  do {
    auVar25._8_4_ = (int)lVar15;
    auVar25._0_8_ = lVar15;
    auVar25._12_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar23 = (auVar25 | auVar4) ^ auVar24;
    if (auVar23._4_4_ == -0x80000000 && auVar23._0_4_ < -0x7ffffff1) {
      pLVar6->vSets[lVar15 + -0xf] =
           (Vec_Int_t *)(puVar14 + CONCAT44(-(uint)(iVar5 << iVar22 < 0),iVar5 << iVar22));
      pLVar6->vSets[lVar15 + -0xe] = (Vec_Int_t *)(puVar14 + CONCAT44(-(uint)(iVar26 < 0),iVar26));
    }
    lVar15 = lVar15 + 2;
    iVar5 = iVar5 + 2;
    iVar26 = iVar26 + 2;
  } while (lVar15 != 0x10);
  return pLVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Man_t * Lpk_ManStart( Lpk_Par_t * pPars )
{
    Lpk_Man_t * p;
    int i, nWords;
    assert( pPars->nLutsMax <= 16 );
    assert( pPars->nVarsMax > 0 && pPars->nVarsMax <= 16 );
    p = ABC_ALLOC( Lpk_Man_t, 1 );
    memset( p, 0, sizeof(Lpk_Man_t) );
    p->pPars = pPars;
    p->nCutsMax = LPK_CUTS_MAX;
    p->vTtElems = Vec_PtrAllocTruthTables( pPars->nVarsMax );
    p->vTtNodes = Vec_PtrAllocSimInfo( 1024, Abc_TruthWordNum(pPars->nVarsMax) );
    p->vCover   = Vec_IntAlloc( 1 << 12 );
    p->vLeaves  = Vec_PtrAlloc( 32 );
    p->vTemp    = Vec_PtrAlloc( 32 );
    for ( i = 0; i < 8; i++ )
        p->vSets[i] = Vec_IntAlloc(100);
    p->pDsdMan = Kit_DsdManAlloc( pPars->nVarsMax, 64 );
    p->vMemory = Vec_IntAlloc( 1024 * 32 );
    p->vBddDir = Vec_IntAlloc( 256 );
    p->vBddInv = Vec_IntAlloc( 256 );
    // allocate temporary storage for truth tables
    nWords = Kit_TruthWordNum(pPars->nVarsMax);
    p->ppTruths[0][0] = ABC_ALLOC( unsigned, 32 * nWords );
    p->ppTruths[1][0] = p->ppTruths[0][0] + 1 * nWords;
    for ( i = 1; i < 2; i++ )
        p->ppTruths[1][i] = p->ppTruths[1][0] + i * nWords;
    p->ppTruths[2][0] = p->ppTruths[1][0] + 2 * nWords;
    for ( i = 1; i < 4; i++ )
        p->ppTruths[2][i] = p->ppTruths[2][0] + i * nWords;
    p->ppTruths[3][0] = p->ppTruths[2][0] + 4 * nWords; 
    for ( i = 1; i < 8; i++ )
        p->ppTruths[3][i] = p->ppTruths[3][0] + i * nWords;
    p->ppTruths[4][0] = p->ppTruths[3][0] + 8 * nWords; 
    for ( i = 1; i < 16; i++ )
        p->ppTruths[4][i] = p->ppTruths[4][0] + i * nWords;
    return p;
}